

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForService
          (Generator *this,ServiceDescriptor *service_descriptor)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long lVar6;
  long lVar7;
  string method_name;
  string method_options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string descriptor_name;
  string service_options;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  ModuleLevelServiceDescriptorName_abi_cxx11_(&local_70,this,service_descriptor);
  MessageLite::SerializeAsString_abi_cxx11_(&local_b0,*(MessageLite **)(service_descriptor + 0x18));
  OptionsValue(&local_50,this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar2 != 0) {
    io::Printer::Print<char[11],std::__cxx11::string,char[17],std::__cxx11::string>
              (this->printer_,
               "$descriptor$._options = None\n$descriptor$._serialized_options = $serialized_value$\n"
               ,(char (*) [11])0x43d321,&local_70,(char (*) [17])"serialized_value",&local_50);
  }
  if (0 < *(int *)(service_descriptor + 0x28)) {
    lVar6 = 0x38;
    lVar7 = 0;
    do {
      lVar1 = *(long *)(service_descriptor + 0x20);
      MessageLite::SerializeAsString_abi_cxx11_(&local_f0,*(MessageLite **)(lVar1 + lVar6));
      OptionsValue(&local_b0,this,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar2 != 0) {
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,local_70._M_dataplus._M_p,
                   local_70._M_dataplus._M_p + local_70._M_string_length);
        std::__cxx11::string::append((char *)local_90);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_90,**(ulong **)(lVar1 + -0x30 + lVar6));
        local_d0 = &local_c0;
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_c0 = *plVar4;
          lStack_b8 = plVar3[3];
        }
        else {
          local_c0 = *plVar4;
          local_d0 = (long *)*plVar3;
        }
        local_c8 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_f0.field_2._M_allocated_capacity = *psVar5;
          local_f0.field_2._8_8_ = plVar3[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar5;
          local_f0._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_f0._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_d0 != &local_c0) {
          operator_delete(local_d0);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        io::Printer::Print<char[11],std::__cxx11::string,char[17],std::__cxx11::string>
                  (this->printer_,
                   "$descriptor$._options = None\n$descriptor$._serialized_options = $serialized_value$\n"
                   ,(char (*) [11])0x43d321,&local_f0,(char (*) [17])"serialized_value",&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x40;
    } while (lVar7 < *(int *)(service_descriptor + 0x28));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::FixOptionsForService(
    const ServiceDescriptor& service_descriptor) const {
  std::string descriptor_name =
      ModuleLevelServiceDescriptorName(service_descriptor);
  std::string service_options =
      OptionsValue(service_descriptor.options().SerializeAsString());
  if (service_options != "None") {
    PrintDescriptorOptionsFixingCode(descriptor_name, service_options,
                                     printer_);
  }

  for (int i = 0; i < service_descriptor.method_count(); ++i) {
    const MethodDescriptor* method = service_descriptor.method(i);
    std::string method_options =
        OptionsValue(method->options().SerializeAsString());
    if (method_options != "None") {
      std::string method_name =
          descriptor_name + ".methods_by_name['" + method->name() + "']";
      PrintDescriptorOptionsFixingCode(method_name, method_options, printer_);
    }
  }
}